

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.h
# Opt level: O2

void __thiscall wallet::CKeyPool::Unserialize<DataStream>(CKeyPool *this,DataStream *s)

{
  long lVar1;
  uint64_t uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ser_readdata32<DataStream>(s);
  uVar2 = ser_readdata64<DataStream>(s);
  this->nTime = uVar2;
  CPubKey::Unserialize<DataStream>(&this->vchPubKey,s);
  ::Unserialize<DataStream>(s,&this->fInternal);
  ::Unserialize<DataStream>(s,&this->m_pre_split);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> int{}; // Discard unused field
        s >> nTime >> vchPubKey;
        try {
            s >> fInternal;
        } catch (std::ios_base::failure&) {
            /* flag as external address if we can't read the internal boolean
               (this will be the case for any wallet before the HD chain split version) */
            fInternal = false;
        }
        try {
            s >> m_pre_split;
        } catch (std::ios_base::failure&) {
            /* flag as postsplit address if we can't read the m_pre_split boolean
               (this will be the case for any wallet that upgrades to HD chain split) */
            m_pre_split = false;
        }
    }